

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_start.cpp
# Opt level: O1

void __thiscall FTTYStartupScreen::NetProgress(FTTYStartupScreen *this,int count)

{
  if (count == 0) {
    this->NetCurPos = this->NetCurPos + 1;
  }
  else if (0 < count) {
    this->NetCurPos = count;
  }
  if (this->NetMaxPos == 0) {
    NetProgress(this);
  }
  else {
    if (this->NetMaxPos < 2) {
      return;
    }
    NetProgress();
  }
  fflush(_stderr);
  return;
}

Assistant:

void FTTYStartupScreen::NetProgress(int count)
{
	int i;

	if (count == 0)
	{
		NetCurPos++;
	}
	else if (count > 0)
	{
		NetCurPos = count;
	}
	if (NetMaxPos == 0)
	{
		// Spinny-type progress meter, because we're a guest waiting for the host.
		fprintf (stderr, "\r%s: %c", TheNetMessage, SpinnyProgressChars[NetCurPos & 3]);
		fflush (stderr);
	}
	else if (NetMaxPos > 1)
	{
		// Dotty-type progress meter.
		fprintf (stderr, "\r%s: ", TheNetMessage);
		for (i = 0; i < NetCurPos; ++i)
		{
			fputc ('.', stderr);
		}
		fprintf (stderr, "%*c[%2d/%2d]", NetMaxPos + 1 - NetCurPos, ' ', NetCurPos, NetMaxPos);
		fflush (stderr);
	}
}